

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEBody.cpp
# Opt level: O0

void __thiscall CEBody::CEBody(CEBody *this,CEBody *other,string *name)

{
  long lVar1;
  CESkyCoord *in_RDX;
  CESkyCoord *in_RSI;
  CEBody *in_RDI;
  CEBody *other_00;
  
  CESkyCoord::CESkyCoord(in_RSI,in_RDX);
  (in_RDI->super_CESkyCoord)._vptr_CESkyCoord = (_func_int **)&PTR__CEBody_00150710;
  other_00 = (CEBody *)&in_RDI->name_;
  std::__cxx11::string::string((string *)other_00);
  init_members((CEBody *)0x1258ad);
  copy_members(in_RDI,other_00);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    SetName(in_RDI,(string *)other_00);
  }
  return;
}

Assistant:

CEBody::CEBody(const CEBody&      other, 
               const std::string& name) :
    CESkyCoord(other)
{
    init_members();
    copy_members(other);

    // Set the name if it is not empty
    if (name.size() > 0) SetName(name);
}